

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Repetition.hpp
# Opt level: O1

void InstructionSet::x86::Primitive::
     ins<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)0,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (unsigned_short *eCX,uint16_t port,unsigned_short *eDI,Context *context)

{
  uint uVar1;
  unsigned_short uVar2;
  uint uVar3;
  uint16_t *puVar4;
  
  uVar2 = PCCompatible::IO<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::
          in<unsigned_short>(&context->io,port);
  uVar1 = ((context->memory).segments_)->es_base_;
  uVar3 = uVar1 + *eDI & 0xfffff;
  if (*eDI == 0xffff) {
    (context->memory).write_back_address_[0] = uVar3;
    (context->memory).write_back_address_[1] = uVar1 & 0xfffff;
  }
  else {
    if (uVar3 != 0xfffff) {
      puVar4 = (uint16_t *)((context->memory).memory._M_elems + uVar3);
      goto LAB_003904f8;
    }
    (context->memory).write_back_address_[0] = 0xfffff;
    (context->memory).write_back_address_[1] = 0;
  }
  puVar4 = &(context->memory).write_back_value_;
LAB_003904f8:
  *puVar4 = uVar2;
  *eDI = *eDI + (short)(context->flags).direction_ * 2;
  return;
}

Assistant:

void ins(
	AddressT &eCX,
	uint16_t port,
	AddressT &eDI,
	ContextT &context
) {
	if(repetition_over<AddressT, repetition>(eCX)) {
		return;
	}

	context.memory.template access<IntT, AccessType::Write>(Source::ES, eDI) = context.io.template in<IntT>(port);
	eDI += context.flags.template direction<AddressT>() * sizeof(IntT);

	repeat<AddressT, repetition>(eCX, context);
}